

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTimer.h
# Opt level: O2

void __thiscall
FactorTimer::reportFactorLevel0Clock(FactorTimer *this,HighsTimerClock *factor_timer_clock)

{
  initializer_list<int> __l;
  allocator_type local_59;
  _Vector_base<int,_std::allocator<int>_> local_58;
  vector<int,_std::allocator<int>_> factor_clock_list;
  int local_28 [4];
  
  local_28[0] = 0;
  local_28[1] = 0x26;
  local_28[2] = 5;
  local_28[3] = 0x19;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<int,_std::allocator<int>_>::vector(&factor_clock_list,__l,&local_59);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,&factor_clock_list);
  reportFactorClockList
            (this,"FactorLevel0",factor_timer_clock,(vector<int,_std::allocator<int>_> *)&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&factor_clock_list.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void reportFactorLevel0Clock(HighsTimerClock& factor_timer_clock) {
    std::vector<HighsInt> factor_clock_list{FactorInvert, FactorReinvert,
                                            FactorFtran, FactorBtran};
    reportFactorClockList("FactorLevel0", factor_timer_clock,
                          factor_clock_list);
  }